

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O3

bool __thiscall
embree::motion_derivative_regression_test::testMDC
          (motion_derivative_regression_test *this,MotionDerivativeCoefficients *mdc)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int dim;
  int dim_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *p1_00;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_float>
  __aurng;
  mt19937_64 *__urng;
  bool bVar5;
  float fVar6;
  uint numRoots;
  Interval1f interval;
  Vec3fa p1;
  Vec3fa p0;
  MotionDerivative md;
  float roots [32];
  uint local_150;
  float local_14c;
  float local_148;
  float local_138;
  Interval1f local_128;
  ulong local_120;
  EvalMotionDerivative<embree::Interval<float>_> local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  MotionDerivative local_dc;
  float local_b8 [34];
  
  if (NAN(mdc->theta)) {
LAB_00a00915:
    bVar5 = false;
  }
  else {
    lVar2 = 1;
    do {
      if (NAN(mdc->coeffs[lVar2 + -1])) goto LAB_00a00915;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xa9);
    __urng = &this->rng;
    bVar5 = false;
    local_120 = 0;
    do {
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        (__urng);
      local_148 = (fVar6 + 0.0) * 20.0 + -10.0;
      local_138 = std::
                  generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            (__urng);
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        (__urng);
      local_f8.m128[1] = (local_138 + 0.0) * 20.0 + -10.0;
      local_f8.m128[0] = local_148;
      local_f8.m128[2] = (fVar6 + 0.0) * 20.0 + -10.0;
      local_f8.m128[3] = 0.0;
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        (__urng);
      local_148 = (fVar6 + 0.0) * 20.0 + -10.0;
      local_138 = std::
                  generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            (__urng);
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        (__urng);
      local_108.m128[1] = (local_138 + 0.0) * 20.0 + -10.0;
      local_108.m128[0] = local_148;
      local_108.m128[2] = (fVar6 + 0.0) * 20.0 + -10.0;
      local_108.m128[3] = 0.0;
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        (__urng);
      local_14c = (fVar6 + 0.0) * 20.0 + -10.0;
      dim_00 = 0;
      do {
        fVar6 = std::
                generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (__urng);
        p1_00 = &local_f8;
        if (0.5 < fVar6) {
          p1_00 = &local_108;
        }
        MotionDerivative::MotionDerivative
                  (&local_dc,mdc,dim_00,(Vec3fa *)&local_f8.field_1,(Vec3fa *)&p1_00->field_1);
        fVar6 = std::
                generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (__urng);
        local_148 = fVar6 + 0.0 + fVar6 + 0.0 + -1.0;
        fVar6 = std::
                generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (__urng);
        local_138 = fVar6 + 0.0 + local_148;
        local_128.lower = local_148;
        local_150 = 0;
        local_118.offset = local_14c;
        local_128.upper = local_138;
        local_118.md = &local_dc;
        MotionDerivative::
        findRoots<embree::MotionDerivative::EvalMotionDerivative<embree::Interval<float>>>
                  (&local_118,&local_128,&local_150,local_b8,0x20);
        uVar3 = (ulong)local_150;
        if (0x1f < uVar3) {
          return bVar5;
        }
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            if (local_b8[uVar4] < local_148) {
              return bVar5;
            }
            if (local_138 < local_b8[uVar4]) {
              return bVar5;
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        dim_00 = dim_00 + 1;
      } while (dim_00 != 3);
      bVar5 = 0x1e < (uint)local_120;
      uVar1 = (uint)local_120 + 1;
      local_120 = (ulong)uVar1;
    } while (uVar1 != 0x20);
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool testMDC(MotionDerivativeCoefficients const& mdc)
    {
      if (!valid(mdc.theta)) return false;
      for (int i = 0; i < 3*8*7; ++i)
      {
        if(!valid(mdc.coeffs[i])) return false;
      }

      unsigned int maxNumRoots = 32;
      float roots[32];
      for (int j = 0; j < 32; ++j)
      {
        Vec3fa p0(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
        Vec3fa p1(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
        float offset = 20.f * rand01() - 10.f;

        for (int dim = 0; dim < 3; ++dim) {
          MotionDerivative md(mdc, dim, p0, rand01() > 0.5f ? p1 : p0);
          float tmin = 2.f * rand01() - 1.f;
          float tmax = tmin + rand01();
          Interval1f interval(tmin, tmax);
          unsigned int num_roots = md.findRoots(interval, offset, roots, maxNumRoots);
          if (num_roots >= maxNumRoots) {
            return false;
          }
          for (unsigned int i = 0; i < min(num_roots, maxNumRoots); ++i) {
            if(!valid(roots[i])) return false;
            if(!(roots[i] >= tmin && roots[i] <= tmax)) return false;
          }
        }
      }

      return true;
    }